

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmMakefileUtilityTargetGenerator::~cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmOSXBundleGenerator *pcVar2;
  pointer pcVar3;
  
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_006f0e30;
  pcVar2 = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator;
  if (pcVar2 != (cmOSXBundleGenerator *)0x0) {
    pcVar3 = (pcVar2->ConfigName)._M_dataplus._M_p;
    paVar1 = &(pcVar2->ConfigName).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != paVar1) {
      operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
    }
  }
  operator_delete(pcVar2,0x40);
  cmMakefileTargetGenerator::~cmMakefileTargetGenerator(&this->super_cmMakefileTargetGenerator);
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::~cmMakefileUtilityTargetGenerator()
{
  delete this->OSXBundleGenerator;
}